

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

bool __thiscall ghc::filesystem::directory_entry::is_regular_file(directory_entry *this)

{
  file_type in_EAX;
  file_type local_18 [2];
  
  local_18[0] = (this->_status)._type;
  if (local_18[0] == none) {
    local_18[0] = in_EAX;
    filesystem::status((filesystem *)local_18,&this->_path);
  }
  return local_18[0] == regular;
}

Assistant:

GHC_INLINE file_type file_status::type() const noexcept
{
    return _type;
}